

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmElementSegment.cpp
# Opt level: O3

void __thiscall
Wasm::WasmElementSegment::WasmElementSegment
          (WasmElementSegment *this,ArenaAllocator *alloc,uint32 index,WasmNode initExpr,
          uint32 numElem)

{
  undefined8 in_stack_00000008;
  
  this->m_alloc = alloc;
  this->m_index = index;
  *(undefined8 *)&this->m_offsetExpr = in_stack_00000008;
  (this->m_offsetExpr).field_1.block = (WasmBlock)initExpr._0_8_;
  (this->m_offsetExpr).field_1.brTable.targetTable = (uint32 *)initExpr.field_1.block;
  *(uint32 **)((long)&(this->m_offsetExpr).field_1 + 0x10) = initExpr.field_1.brTable.targetTable;
  this->m_numElem = numElem;
  this->m_offset = 0;
  this->m_elemIdx = 0;
  this->m_elems = (uint32 *)0x0;
  return;
}

Assistant:

WasmElementSegment::WasmElementSegment(ArenaAllocator* alloc, const uint32 index, const WasmNode initExpr, const uint32 numElem) :
        m_alloc(alloc),
        m_index(index),
        m_offsetExpr(initExpr),
        m_numElem(numElem),
        m_offset(0),
        m_elemIdx(0),
        m_elems(nullptr)
    {}